

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void raster_size(char *fn,int num,int *x,int *y)

{
  char cVar1;
  size_t sVar2;
  uint __fd;
  ssize_t sVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  int *extraout_RDX;
  int iVar7;
  char *__file;
  raster_t hd;
  string s1;
  string s2;
  char local_118 [4];
  int local_114;
  int local_110;
  char local_c8 [80];
  char local_78 [88];
  
  piVar4 = y;
  sprintf(local_c8,"%d",num);
  sVar5 = 0xffffffffffffffff;
  do {
    cVar1 = fn[sVar5 + 1];
    local_118[sVar5 + 1] = cVar1;
    sVar5 = sVar5 + 1;
  } while (cVar1 != '\0');
  sVar2 = sVar5;
  do {
    sVar6 = sVar2;
    cVar1 = local_c8[sVar6 - (long)(int)sVar5];
    piVar4 = (int *)CONCAT71((int7)((ulong)piVar4 >> 8),cVar1);
    local_118[sVar6] = cVar1;
    sVar2 = sVar6 + 1;
  } while (cVar1 != '\0');
  local_118[sVar6] = '\0';
  __file = local_78;
  memcpy(__file,local_118,sVar6 + 1);
  iVar7 = 0;
  __fd = open(__file,0);
  if (0 < (int)__fd) {
    __file = (char *)(ulong)__fd;
    iVar7 = (int)local_118;
    sVar3 = read(__fd,local_118,0x20);
    if (sVar3 == 0x20) {
      *x = local_114;
      *y = local_110;
      if ((0x13c < *x) || (0x13c < local_110)) goto LAB_00103271;
    }
    close(__fd);
    return;
  }
  raster_size_cold_1();
LAB_00103271:
  raster_size_cold_2();
  *extraout_RDX = iVar7;
  *piVar4 = (int)__file;
  if (((int)__file < 0x13d) && (*extraout_RDX < 0x13d)) {
    return;
  }
  binary_size_cold_1();
  if ((ulong)__file >> 0x20 != 0xffffffff && (int)__file != -1) {
    return;
  }
  return;
}

Assistant:

void raster_size(fn,num,x,y)
char *fn ;
int num, *x, *y ;

{ raster_t hd ;
  string s1, s2 ;
  int fd ;

  sprintf(s1,"%d",num);
  concat(fn,s1,s2) ;
  if ((fd = open(s2,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > X || *y > Y) {
        error(10) ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}